

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O1

void __thiscall
stateObservation::ZmpTrackingGainEstimator::setGain
          (ZmpTrackingGainEstimator *this,Vector3 *gain,Vector3 *uncertainty)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double *pdVar5;
  ActualDstType actualDst;
  Matrix5 P;
  double dStack_148;
  double *pdStack_140;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  double local_f8;
  double local_e8 [6];
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  pdStack_140 = (double *)0x181d27;
  setGain(this,gain);
  pdStack_140 = (double *)0x181d39;
  KalmanFilterBase::getStateCovariance
            ((Pmatrix *)&local_138,&(this->filter_).super_KalmanFilterBase);
  if ((local_138.m_rows != 5) || (local_138.m_cols != 5)) {
    pdStack_140 = (double *)0x181f86;
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 5, 5>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 5, 5>]"
                 );
  }
  local_e8[0] = *local_138.m_data;
  local_e8[1] = local_138.m_data[1];
  local_e8[2] = local_138.m_data[2];
  local_e8[3] = local_138.m_data[3];
  local_e8[4] = local_138.m_data[4];
  local_e8[5] = local_138.m_data[5];
  local_b8 = local_138.m_data[6];
  dStack_b0 = local_138.m_data[7];
  local_a8 = local_138.m_data[8];
  dStack_a0 = local_138.m_data[9];
  local_98 = local_138.m_data[10];
  dStack_90 = local_138.m_data[0xb];
  local_88 = local_138.m_data[0xc];
  dStack_80 = local_138.m_data[0xd];
  local_78 = local_138.m_data[0xe];
  dStack_70 = local_138.m_data[0xf];
  local_68 = local_138.m_data[0x10];
  dStack_60 = local_138.m_data[0x11];
  local_58 = local_138.m_data[0x12];
  dStack_50 = local_138.m_data[0x13];
  local_48 = local_138.m_data[0x14];
  dStack_40 = local_138.m_data[0x15];
  local_38 = local_138.m_data[0x16];
  dStack_30 = local_138.m_data[0x17];
  local_28 = local_138.m_data[0x18];
  pdStack_140 = (double *)0x181e09;
  free(local_138.m_data);
  lVar4 = 0x50;
  do {
    *(undefined8 *)((long)local_e8 + lVar4) = 0;
    *(undefined8 *)((long)local_e8 + lVar4 + 8) = 0;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 200);
  lVar4 = 0x10;
  do {
    *(undefined8 *)((long)local_e8 + lVar4) = 0;
    *(undefined8 *)((long)local_e8 + lVar4 + 8) = 0;
    *(undefined8 *)((long)local_e8 + lVar4 + 0x10) = 0;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 == 0x38);
  dVar2 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0];
  dVar3 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar1 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  local_138.m_rows = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_138.m_cols = 0;
  uStack_120 = 0;
  local_138.m_data = (double *)(dVar2 * dVar2);
  local_118 = dVar3 * dVar3;
  local_f8 = dVar1 * dVar1;
  lVar4 = 0x10;
  pdVar5 = &local_78;
  do {
    dVar1 = *(double *)((long)&pdStack_140 + lVar4);
    pdVar5[-2] = *(double *)((long)&dStack_148 + lVar4);
    pdVar5[-1] = dVar1;
    *pdVar5 = *(double *)((long)&local_138.m_data + lVar4);
    lVar4 = lVar4 + 0x18;
    pdVar5 = pdVar5 + 5;
  } while (lVar4 != 0x58);
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  local_138.m_cols = 0;
  pdStack_140 = (double *)0x181ed0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,0x19,5,5);
  if ((local_138.m_rows != 5) || (local_138.m_cols != 5)) {
    pdStack_140 = (double *)0x181ef7;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,0x19,5,5);
  }
  pdVar5 = local_138.m_data;
  if ((local_138.m_rows == 5) && (local_138.m_cols == 5)) {
    pdStack_140 = (double *)0x181f31;
    memcpy(local_138.m_data,local_e8,0xc0);
    pdVar5[0x18] = local_28;
    pdStack_140 = (double *)0x181f51;
    KalmanFilterBase::setStateCovariance
              (&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_138);
    pdStack_140 = (double *)0x181f5a;
    free(local_138.m_data);
    return;
  }
  pdStack_140 = (double *)&LAB_00181fa5;
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 5, 5>, T1 = double, T2 = double]"
               );
}

Assistant:

void ZmpTrackingGainEstimator::setGain(const Vector3 & gain, const Vector3 & uncertainty)
{
  setGain(gain);
  Matrix5 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P.topRightCorner<2, 3>().setZero();
  P.bottomLeftCorner<3, 2>().setZero();
  /// updating the gain part
  P.bottomRightCorner<3, 3>() = Vec3ToSqDiag_(uncertainty);
  filter_.setStateCovariance(P);
}